

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O1

void __thiscall
Iir::BandPassTransform::BandPassTransform
          (BandPassTransform *this,double fc,double fw,LayoutBase *digital,LayoutBase *analog)

{
  uint uVar1;
  invalid_argument *this_00;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  int pairIndex;
  int pairIndex_00;
  double dVar2;
  double dVar3;
  complex_t c;
  complex_t c_00;
  complex_t c_01;
  complex_t c_02;
  ComplexPair z1;
  ComplexPair p1;
  ComplexPair local_70;
  ComplexPair local_50;
  undefined8 extraout_RDX_00;
  
  this->ab = 0.0;
  this->ab_2 = 0.0;
  this->a2 = 0.0;
  this->b2 = 0.0;
  this->a = 0.0;
  this->b = 0.0;
  this->wc = 0.0;
  this->wc2 = 0.0;
  if (0.5 <= fc) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"The cutoff frequency needs to be below the Nyquist frequency.");
  }
  else {
    if (0.0 <= fc) {
      digital->m_numPoles = 0;
      dVar2 = fc * 6.283185307179586 + fw * 6.283185307179586 * -0.5;
      this->wc2 = dVar2;
      dVar3 = fw * 6.283185307179586 + dVar2;
      this->wc = dVar3;
      if (dVar2 < 1e-08) {
        this->wc2 = 1e-08;
      }
      if (3.141592643589793 < dVar3) {
        this->wc = 3.141592643589793;
      }
      dVar2 = cos((this->wc + this->wc2) * 0.5);
      dVar3 = cos((this->wc - this->wc2) * 0.5);
      this->a = dVar2 / dVar3;
      dVar3 = tan((this->wc - this->wc2) * 0.5);
      dVar3 = 1.0 / dVar3;
      this->b = dVar3;
      dVar2 = this->a;
      this->a2 = dVar2 * dVar2;
      this->b2 = dVar3 * dVar3;
      dVar3 = dVar3 * dVar2;
      this->ab = dVar3;
      this->ab_2 = dVar3 + dVar3;
      uVar1 = analog->m_numPoles;
      pairIndex = (int)uVar1 / 2;
      if (1 < (int)uVar1) {
        pairIndex_00 = 0;
        do {
          LayoutBase::getPair(analog,pairIndex_00);
          c._M_value._8_8_ = in_RCX;
          c._M_value._0_8_ = extraout_RDX;
          transform(&local_50,this,c);
          c_00._M_value._8_8_ = in_RCX;
          c_00._M_value._0_8_ = extraout_RDX_00;
          transform(&local_70,this,c_00);
          LayoutBase::addPoleZeroConjugatePairs
                    (digital,(complex_t *)&local_50,(complex_t *)&local_70);
          LayoutBase::addPoleZeroConjugatePairs
                    (digital,&local_50.super_complex_pair_t.second,
                     &local_70.super_complex_pair_t.second);
          pairIndex_00 = pairIndex_00 + 1;
        } while (pairIndex != pairIndex_00);
      }
      if ((uVar1 & 1) != 0) {
        LayoutBase::getPair(analog,pairIndex);
        c_01._M_value._8_8_ = in_RCX;
        c_01._M_value._0_8_ = extraout_RDX_01;
        transform(&local_50,this,c_01);
        LayoutBase::getPair(analog,pairIndex);
        c_02._M_value._8_8_ = in_RCX;
        c_02._M_value._0_8_ = extraout_RDX_02;
        transform(&local_70,this,c_02);
        LayoutBase::add(digital,&local_50,&local_70);
      }
      dVar2 = analog->m_normalW;
      dVar3 = tan((this->wc + dVar2) * 0.5);
      dVar2 = tan((dVar2 + this->wc2) * 0.5);
      dVar2 = dVar2 * dVar3;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      dVar3 = atan(dVar2);
      dVar2 = analog->m_normalGain;
      digital->m_normalW = dVar3 + dVar3;
      digital->m_normalGain = dVar2;
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Cutoff frequency is negative.");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

BandPassTransform::BandPassTransform (double fc,
                                      double fw,
                                      LayoutBase& digital,
                                      LayoutBase const& analog)
{
	if (!(fc < 0.5)) throw_invalid_argument(cutoffError);
	if (fc < 0.0) throw_invalid_argument(cutoffNeg);

	digital.reset ();
	
	const double ww = 2 * doublePi * fw;
	
	// pre-calcs
	wc2 = 2 * doublePi * fc - (ww / 2);
	wc  = wc2 + ww;
	
	// what is this crap?
	if (wc2 < 1e-8)
		wc2 = 1e-8;
	if (wc  > doublePi-1e-8)
		wc  = doublePi-1e-8;
	
	a =     cos ((wc + wc2) * 0.5) /
		cos ((wc - wc2) * 0.5);
	b = 1 / tan ((wc - wc2) * 0.5);
	a2 = a * a;
	b2 = b * b;
	ab = a * b;
	ab_2 = 2 * ab;
	
	const int numPoles = analog.getNumPoles ();
	const int pairs = numPoles / 2;
	for (int i = 0; i < pairs; ++i)
	{
		const PoleZeroPair& pair = analog[i];
		ComplexPair p1 = transform (pair.poles.first);
		ComplexPair z1 = transform (pair.zeros.first);
		
		digital.addPoleZeroConjugatePairs (p1.first, z1.first);
		digital.addPoleZeroConjugatePairs (p1.second, z1.second);
	}
	
	if (numPoles & 1)
	{
		ComplexPair poles = transform (analog[pairs].poles.first);
		ComplexPair zeros = transform (analog[pairs].zeros.first);
		
		digital.add (poles, zeros);
	}
	
	double wn = analog.getNormalW();
	digital.setNormal (2 * atan (sqrt (tan ((wc + wn)* 0.5) * tan((wc2 + wn)* 0.5))),
			   analog.getNormalGain());
}